

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase189::run(TestCase189 *this)

{
  bool bVar1;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_> SVar2;
  char *pcVar3;
  char *pcVar4;
  bool local_151;
  undefined1 local_150 [7];
  bool _kj_shouldLog_5;
  int local_138;
  bool local_131;
  int *piStack_130;
  bool _kj_shouldLog_4;
  int *i_2;
  Maybe<int> local_120;
  Maybe<int> result_2;
  Input input_2;
  undefined1 local_f0 [7];
  bool _kj_shouldLog_3;
  int local_d8;
  bool local_d1;
  int *piStack_d0;
  bool _kj_shouldLog_2;
  int *i_1;
  Maybe<int> local_c0;
  Maybe<int> result_1;
  Input input_1;
  undefined1 local_90 [7];
  bool _kj_shouldLog_1;
  int local_78;
  bool local_71;
  int *piStack_70;
  bool _kj_shouldLog;
  int *i;
  Maybe<unsigned_int> local_58;
  Maybe<int> local_50;
  Maybe<int> result;
  Input input;
  undefined1 local_20 [5];
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_> parser;
  StringPtr text;
  TestCase189 *this_local;
  
  StringPtr::StringPtr((StringPtr *)local_20,"foooob");
  input.best._3_1_ = 0x66;
  input.best._4_1_ = exactly<char>((char *)((long)&input.best + 3));
  input.best._0_1_ = 0x6f;
  input.best._1_1_ = exactly<char>((char *)&input.best);
  input.best._2_1_ =
       (char)many<kj::parse::Exactly_<char>>((Exactly_<char> *)((long)&input.best + 1));
  SVar2 = sequence<kj::parse::Exactly_<char>,kj::parse::Many_<kj::parse::Exactly_<char>,false>>
                    ((Exactly_<char> *)((long)&input.best + 4),
                     (Many_<kj::parse::Exactly_<char>,_false> *)((long)&input.best + 2));
  input.best._5_2_ = SVar2._0_2_;
  input.best._7_1_ = SVar2.rest._1_1_;
  pcVar3 = StringPtr::begin((StringPtr *)local_20);
  pcVar4 = StringPtr::begin((StringPtr *)local_20);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result,pcVar3,pcVar4 + 3);
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_58,(IteratorInput<char,_const_char_*> *)((long)&input.best + 5));
  Maybe<int>::Maybe<unsigned_int>(&local_50,&local_58);
  Maybe<unsigned_int>::~Maybe(&local_58);
  piStack_70 = kj::_::readMaybe<int>(&local_50);
  if (piStack_70 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,200);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_90,(char (*) [22])"Expected 2, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_90);
  }
  else if (*piStack_70 != 2) {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_78 = 2;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xc6,ERROR,"\"failed: expected \" \"(2) == (*i)\", 2, *i",
                 (char (*) [29])"failed: expected (2) == (*i)",&local_78,piStack_70);
      local_71 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)&result);
  if (!bVar1) {
    input_1.best._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (input_1.best._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xca,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      input_1.best._7_1_ = false;
    }
  }
  Maybe<int>::~Maybe(&local_50);
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)&result);
  pcVar3 = StringPtr::begin((StringPtr *)local_20);
  pcVar4 = StringPtr::begin((StringPtr *)local_20);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result_1,pcVar3,pcVar4 + 5);
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&i_1,(IteratorInput<char,_const_char_*> *)((long)&input.best + 5));
  Maybe<int>::Maybe<unsigned_int>(&local_c0,(Maybe<unsigned_int> *)&i_1);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&i_1);
  piStack_d0 = kj::_::readMaybe<int>(&local_c0);
  if (piStack_d0 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xd3);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_f0,(char (*) [22])"Expected 4, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_f0);
  }
  else if (*piStack_d0 != 4) {
    local_d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_d1 != false) {
      local_d8 = 4;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xd1,ERROR,"\"failed: expected \" \"(4) == (*i)\", 4, *i",
                 (char (*) [29])"failed: expected (4) == (*i)",&local_d8,piStack_d0);
      local_d1 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)&result_1);
  if (!bVar1) {
    input_2.best._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (input_2.best._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xd5,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      input_2.best._7_1_ = false;
    }
  }
  Maybe<int>::~Maybe(&local_c0);
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)&result_1);
  pcVar3 = StringPtr::begin((StringPtr *)local_20);
  pcVar4 = StringPtr::end((StringPtr *)local_20);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result_2,pcVar3,pcVar4);
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&i_2,(IteratorInput<char,_const_char_*> *)((long)&input.best + 5));
  Maybe<int>::Maybe<unsigned_int>(&local_120,(Maybe<unsigned_int> *)&i_2);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&i_2);
  piStack_130 = kj::_::readMaybe<int>(&local_120);
  if (piStack_130 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xde);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_150,(char (*) [22])"Expected 4, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_150);
  }
  else if (*piStack_130 != 4) {
    local_131 = kj::_::Debug::shouldLog(ERROR);
    while (local_131 != false) {
      local_138 = 4;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xdc,ERROR,"\"failed: expected \" \"(4) == (*i)\", 4, *i",
                 (char (*) [29])"failed: expected (4) == (*i)",&local_138,piStack_130);
      local_131 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)&result_2);
  if (bVar1) {
    local_151 = kj::_::Debug::shouldLog(ERROR);
    while (local_151 != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xe0,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      local_151 = false;
    }
  }
  Maybe<int>::~Maybe(&local_120);
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)&result_2);
  return;
}

Assistant:

TEST(CommonParsers, ManyParserCountOnly) {
  StringPtr text = "foooob";

  auto parser = sequence(exactly('f'), many(exactly('o')));

  {
    Input input(text.begin(), text.begin() + 3);
    Maybe<int> result = parser(input);
    KJ_IF_MAYBE(i, result) {
      EXPECT_EQ(2, *i);
    } else {
      ADD_FAILURE() << "Expected 2, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }